

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

void ActionMarkExplicit::processMultiplier(Varnode *vn,int4 max)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  Varnode *this;
  byte local_8a;
  OpStackElement local_88;
  Varnode *local_78;
  Varnode *newvn;
  PcodeOp *op;
  byte local_5d;
  bool isaterm;
  OpStackElement local_50;
  int local_3c;
  Varnode *pVStack_38;
  int4 finalcount;
  Varnode *vncur;
  vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
  opstack;
  int4 max_local;
  Varnode *vn_local;
  
  opstack.
  super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = max;
  std::
  vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>::
  vector((vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
          *)&vncur);
  local_3c = 0;
  OpStackElement::OpStackElement(&local_50,vn);
  std::
  vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>::
  push_back((vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
             *)&vncur,&local_50);
  do {
    pvVar3 = std::
             vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
             ::back((vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
                     *)&vncur);
    pVStack_38 = pvVar3->vn;
    bVar2 = Varnode::isExplicit(pVStack_38);
    local_8a = 1;
    if (!bVar2) {
      bVar2 = Varnode::isWritten(pVStack_38);
      local_8a = bVar2 ^ 0xff;
    }
    local_5d = local_8a & 1;
    if (local_5d == 0) {
      pvVar3 = std::
               vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
               ::back((vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
                       *)&vncur);
      iVar1 = pvVar3->slotback;
      pvVar3 = std::
               vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
               ::back((vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
                       *)&vncur);
      if (iVar1 <= pvVar3->slot) goto LAB_00660085;
      this = (Varnode *)Varnode::getDef(pVStack_38);
      newvn = this;
      pvVar3 = std::
               vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
               ::back((vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
                       *)&vncur);
      iVar1 = pvVar3->slot;
      pvVar3->slot = iVar1 + 1;
      local_78 = PcodeOp::getIn((PcodeOp *)this,iVar1);
      bVar2 = Varnode::isMark(local_78);
      if (bVar2) {
        Varnode::setExplicit(vn);
        Varnode::clearImplied(vn);
      }
      OpStackElement::OpStackElement(&local_88,local_78);
      std::
      vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
      ::push_back((vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
                   *)&vncur,&local_88);
    }
    else {
LAB_00660085:
      if (((local_5d & 1) != 0) && (bVar2 = Varnode::isSpacebase(pVStack_38), !bVar2)) {
        local_3c = local_3c + 1;
      }
      if (opstack.
          super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < local_3c) {
        Varnode::setExplicit(vn);
        Varnode::clearImplied(vn);
        op._4_4_ = 1;
        goto LAB_006601d3;
      }
      std::
      vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
      ::pop_back((vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
                  *)&vncur);
    }
    bVar2 = std::
            vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
            ::empty((vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
                     *)&vncur);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      op._4_4_ = 0;
LAB_006601d3:
      std::
      vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
      ::~vector((vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
                 *)&vncur);
      return;
    }
  } while( true );
}

Assistant:

void ActionMarkExplicit::processMultiplier(Varnode *vn,int4 max)

{
  vector<OpStackElement> opstack;
  Varnode *vncur;
  int4 finalcount = 0;

  opstack.push_back(vn);
  do {
    vncur = opstack.back().vn;
    bool isaterm = vncur->isExplicit() || (!vncur->isWritten());
    if (isaterm || (opstack.back().slotback<=opstack.back().slot)) { // Trimming condition
      if (isaterm) {
	if (!vncur->isSpacebase()) // Don't count space base
	  finalcount += 1;
      }
      if (finalcount > max) {
	vn->setExplicit();	// Make this variable explicit
	vn->clearImplied();
	return;
      }
      opstack.pop_back();
    }
    else {
      PcodeOp *op = vncur->getDef();
      Varnode *newvn = op->getIn(opstack.back().slot++);
      if (newvn->isMark()) {	// If an ancestor is marked(also possible implied with multiple descendants)
	vn->setExplicit();	// then automatically consider this to be explicit
	vn->clearImplied();
      }
      opstack.push_back(newvn);
    }
  } while(!opstack.empty());
}